

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void cfgfile::generator::generate_fields_in_ctor(ostream *stream,const_class_ptr_t c)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  __shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2> *this;
  class_t *in_RSI;
  ostream *in_RDI;
  min_max_constraint_t *min_max;
  constraint_base_t *constr;
  field_t *f;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *__range2;
  allocator *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffcf0;
  allocator *in_stack_fffffffffffffd18;
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  min_max_constraint_t *local_110;
  min_max_constraint_t *local_108;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  reference local_30;
  field_t *local_28;
  __normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
  local_20;
  vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
  *local_18;
  ostream *local_8;
  
  local_8 = in_RDI;
  local_18 = cfg::class_t::fields(in_RSI);
  local_20._M_current =
       (field_t *)
       std::
       vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>::
       begin((vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
              *)in_stack_fffffffffffffce8);
  local_28 = (field_t *)
             std::
             vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
             ::end((vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>
                    *)in_stack_fffffffffffffce8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
                             *)in_stack_fffffffffffffcf0,
                            (__normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
                             *)in_stack_fffffffffffffce8), bVar1) {
    local_30 = __gnu_cxx::
               __normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
               ::operator*(&local_20);
    bVar1 = cfg::field_t::is_base(local_30);
    poVar3 = local_8;
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_50,"\t\t,\tm_",&local_51);
      poVar3 = std::operator<<(poVar3,local_50);
      psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"( *this, Trait::from_ascii( \"",&local_89);
      poVar3 = std::operator<<(poVar3,local_88);
      psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
      poVar3 = std::operator<<(poVar3,(string *)psVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,"\" ), ",&local_b1);
      poVar3 = std::operator<<(poVar3,local_b0);
      cfg::field_t::is_required(local_30);
      bool_to_string_abi_cxx11_(SUB81((ulong)in_stack_fffffffffffffd18 >> 0x38,0));
      poVar3 = std::operator<<(poVar3,local_d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f8," )\n",&local_f9);
      std::operator<<(poVar3,local_f8);
      std::__cxx11::string::~string(local_f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      std::__cxx11::string::~string(local_50);
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
      bVar1 = cfg::field_t::is_constraint_null((field_t *)0x1337dd);
      if (!bVar1) {
        this = &cfg::field_t::constraint(local_30)->
                super___shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>
        ;
        local_108 = (min_max_constraint_t *)
                    std::
                    __shared_ptr<cfgfile::generator::cfg::constraint_base_t,_(__gnu_cxx::_Lock_policy)2>
                    ::get(this);
        iVar2 = (*(local_108->super_constraint_base_t)._vptr_constraint_base_t[2])();
        poVar3 = local_8;
        if (iVar2 == 1) {
          local_110 = local_108;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_130,"\t\t,\tm_",&local_131);
          poVar3 = std::operator<<(poVar3,local_130);
          psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
          poVar3 = std::operator<<(poVar3,(string *)psVar4);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_158,"_constraint( ",&local_159);
          poVar3 = std::operator<<(poVar3,local_158);
          psVar4 = cfg::min_max_constraint_t::min_abi_cxx11_(local_110);
          poVar3 = std::operator<<(poVar3,(string *)psVar4);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_180,", ",&local_181);
          poVar3 = std::operator<<(poVar3,local_180);
          psVar4 = cfg::min_max_constraint_t::max_abi_cxx11_(local_110);
          poVar3 = std::operator<<(poVar3,(string *)psVar4);
          in_stack_fffffffffffffd18 = &local_1a9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1a8," )\n",in_stack_fffffffffffffd18);
          std::operator<<(poVar3,local_1a8);
          std::__cxx11::string::~string(local_1a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
          std::__cxx11::string::~string(local_180);
          std::allocator<char>::~allocator((allocator<char> *)&local_181);
          std::__cxx11::string::~string(local_158);
          std::allocator<char>::~allocator((allocator<char> *)&local_159);
          std::__cxx11::string::~string(local_130);
          std::allocator<char>::~allocator((allocator<char> *)&local_131);
        }
        else if (iVar2 == 2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1d0,"\t\t,\tm_",&local_1d1);
          poVar3 = std::operator<<(poVar3,local_1d0);
          psVar4 = cfg::field_t::name_abi_cxx11_(local_30);
          in_stack_fffffffffffffcf0 = std::operator<<(poVar3,(string *)psVar4);
          in_stack_fffffffffffffce8 = &local_1f9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1f8,"_constraint()\n",in_stack_fffffffffffffce8);
          std::operator<<(in_stack_fffffffffffffcf0,local_1f8);
          std::__cxx11::string::~string(local_1f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
          std::__cxx11::string::~string(local_1d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_cfgfile::generator::cfg::field_t_*,_std::vector<cfgfile::generator::cfg::field_t,_std::allocator<cfgfile::generator::cfg::field_t>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

static inline void generate_fields_in_ctor( std::ostream & stream,
	cfg::const_class_ptr_t c )
{
	for( const cfg::field_t & f : c->fields() )
	{
		if( !f.is_base() )
		{
			stream << std::string( "\t\t,\tm_" )
				<< f.name() << std::string( "( *this, Trait::from_ascii( \"" )
				<< f.name() << std::string( "\" ), " )
				<< bool_to_string( f.is_required() )
				<< std::string( " )\n" );

			if( !f.is_constraint_null() )
			{
				cfg::constraint_base_t * constr = f.constraint().get();

				switch( constr->type() )
				{
					case cfg::constraint_base_t::min_max_constraint_type :
					{
						cfg::min_max_constraint_t * min_max =
							static_cast< cfg::min_max_constraint_t* > ( constr );

						stream << std::string( "\t\t,\tm_" )
							<< f.name() << std::string( "_constraint( " )
							<< min_max->min() << std::string( ", " )
							<< min_max->max() << std::string( " )\n" );
					}
						break;

					case cfg::constraint_base_t::one_of_constraint_type :
					{
						stream << std::string( "\t\t,\tm_" )
							<< f.name() << std::string( "_constraint()\n" );
					}
						break;

					default :
						break;
				}
			}
		}
	}
}